

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O3

int __thiscall HighsCliqueTable::link(HighsCliqueTable *this,char *__from,char *__to)

{
  int *piVar1;
  CliqueVar CVar2;
  pointer pCVar3;
  pointer pCVar4;
  int iVar5;
  uint uVar6;
  pair<const_int_*,_bool> pVar7;
  pair<int_*,_bool> pVar8;
  HighsHashTableEntry<int,_void> entry;
  HighsHashTableEntry<int,_void> local_24;
  HighsHashTableEntry<int,_int> local_20;
  
  local_20.value_ = (int)__from;
  pCVar3 = (this->cliqueentries).
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           ._M_impl.super__Vector_impl_data._M_start;
  CVar2 = pCVar3[local_20.value_];
  piVar1 = (this->numcliquesvar).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + (int)((int)CVar2 << 1 | (uint)((int)CVar2 < 0));
  *piVar1 = *piVar1 + 1;
  local_24.value_ = (int)__to;
  pCVar4 = (this->cliques).
           super__Vector_base<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>.
           _M_impl.super__Vector_impl_data._M_start;
  CVar2 = pCVar3[local_20.value_];
  uVar6 = (int)CVar2 << 1 | (uint)((int)CVar2 < 0);
  if (pCVar4[local_24.value_].end - pCVar4[local_24.value_].start == 2) {
    pVar7 = HighsHashTree<int,_void>::insert_recurse
                      (&(this->invertedHashListSizeTwo).
                        super__Vector_base<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar6].root,
                       ((ulong)__to & 0xffffffff) * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20
                       ^ ((ulong)__to & 0xffffffff) * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,0,
                       &local_24);
    iVar5 = (int)pVar7.first;
  }
  else {
    local_20.key_ = local_24.value_;
    pVar8 = HighsHashTree<int,_int>::insert_recurse
                      (&(this->invertedHashList).
                        super__Vector_base<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)uVar6].root,
                       ((ulong)__to & 0xffffffff) * -0x7f3769c41c1b3d0d + 0x9eefcacfe7301de3 >> 0x20
                       ^ ((ulong)__to & 0xffffffff) * -0x75e7c76a1153eaca + 0x1da24fc66dd63e32,0,
                       &local_20);
    iVar5 = (int)pVar8.first;
  }
  return iVar5;
}

Assistant:

void HighsCliqueTable::link(HighsInt pos, HighsInt cliqueid) {
  assert(pos >= 0);
  assert(!colDeleted[cliqueentries[pos].col]);
  ++numcliquesvar[cliqueentries[pos].index()];

  HighsInt cliquelen = cliques[cliqueid].end - cliques[cliqueid].start;
  if (cliquelen == 2)
    invertedHashListSizeTwo[cliqueentries[pos].index()].insert(cliqueid);
  else
    invertedHashList[cliqueentries[pos].index()].insert(cliqueid, pos);
}